

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void unifyPathDelimiters(char *path,uint pathLength)

{
  char *local_28;
  char *iter;
  char *end;
  uint pathLength_local;
  char *path_local;
  
  if ((path != (char *)0x0) && (pathLength != 0)) {
    for (local_28 = path; local_28 < path + pathLength; local_28 = local_28 + 1) {
      if (*local_28 == '\\') {
        *local_28 = '/';
      }
    }
  }
  return;
}

Assistant:

void unifyPathDelimiters(char * path, unsigned int pathLength)
{
    if (path == 0x0 || pathLength == 0)
    {
        return;
    }

    const char * end = path + pathLength;

    for (char * iter = path; iter < end; ++iter)
    {
        if (*iter == windowsPathDelim)
        {
            *iter = unixPathDelim;
        }
    }
}